

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionKalman4.cpp
# Opt level: O0

void __thiscall
RTFusionKalman4::newIMUData(RTFusionKalman4 *this,RTIMU_DATA *data,RTIMUSettings *settings)

{
  char *pcVar1;
  float local_44;
  int local_34;
  int local_30;
  int j;
  int i;
  RTIMUSettings *local_20;
  RTIMUSettings *settings_local;
  RTIMU_DATA *data_local;
  RTFusionKalman4 *this_local;
  
  local_20 = settings;
  settings_local = (RTIMUSettings *)data;
  data_local = (RTIMU_DATA *)this;
  if (((this->super_RTFusion).m_enableGyro & 1U) == 0) {
    RTVector3::RTVector3((RTVector3 *)&j);
    RTVector3::operator=(&this->m_gyro,(RTVector3 *)&j);
  }
  else {
    RTVector3::operator=(&this->m_gyro,&data->gyro);
  }
  RTVector3::operator=
            (&(this->super_RTFusion).m_accel,
             (RTVector3 *)((settings_local->m_compassCalMin).m_data + 1));
  RTVector3::operator=
            (&(this->super_RTFusion).m_compass,
             (RTVector3 *)((settings_local->m_compassCalMax).m_data + 2));
  (this->super_RTFusion).m_compassValid =
       (bool)(*(byte *)((settings_local->m_compassCalMax).m_data + 1) & 1);
  if (((this->super_RTFusion).m_firstTime & 1U) == 0) {
    local_44 = (float)((long)(settings_local->super_RTIMUHal)._vptr_RTIMUHal -
                      (this->super_RTFusion).m_lastFusionTime);
    this->m_timeDelta = local_44 / 1e+06;
    (this->super_RTFusion).m_lastFusionTime =
         (uint64_t)(settings_local->super_RTIMUHal)._vptr_RTIMUHal;
    if (this->m_timeDelta <= 0.0) {
      return;
    }
    if (((this->super_RTFusion).m_debug & 1U) != 0) {
      printf("%s","\n------\n");
      fflush(_stdout);
      printf("IMU update delta time: %f\n",(double)this->m_timeDelta);
      fflush(_stdout);
    }
    RTFusion::calculatePose
              (&this->super_RTFusion,(RTVector3 *)((settings_local->m_compassCalMin).m_data + 1),
               (RTVector3 *)((settings_local->m_compassCalMax).m_data + 2),
               local_20->m_compassAdjDeclination);
    predict(this);
    update(this);
    RTQuaternion::toEuler(&this->m_stateQ,&(this->super_RTFusion).m_fusionPose);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    if (((this->super_RTFusion).m_debug & 1U) != 0) {
      pcVar1 = RTMath::displayRadians("Measured pose",&(this->super_RTFusion).m_measuredPose);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::displayRadians("Kalman pose",&(this->super_RTFusion).m_fusionPose);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::displayRadians("Measured quat",&(this->super_RTFusion).m_measuredPose);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::display("Kalman quat",&this->m_stateQ);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::display("Error quat",&this->m_stateQError);
      printf("%s",pcVar1);
      fflush(_stdout);
    }
  }
  else {
    (this->super_RTFusion).m_lastFusionTime =
         (uint64_t)(settings_local->super_RTIMUHal)._vptr_RTIMUHal;
    RTFusion::calculatePose
              (&this->super_RTFusion,&(this->super_RTFusion).m_accel,
               &(this->super_RTFusion).m_compass,local_20->m_compassAdjDeclination);
    RTMatrix4x4::fill(&this->m_Fk,0.0);
    RTMatrix4x4::fill(&this->m_Pkk,0.0);
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        RTMatrix4x4::setVal(&this->m_Pkk,local_30,local_34,0.5);
      }
    }
    RTQuaternion::fromEuler(&this->m_stateQ,&(this->super_RTFusion).m_measuredPose);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    RTVector3::operator=
              (&(this->super_RTFusion).m_fusionPose,&(this->super_RTFusion).m_measuredPose);
    (this->super_RTFusion).m_firstTime = false;
  }
  (settings_local->super_RTIMUHal).m_busIsI2C = true;
  *(undefined1 *)&(settings_local->super_RTIMUHal).m_SPI = 1;
  RTVector3::operator=
            ((RTVector3 *)&(settings_local->super_RTIMUHal).m_SPISpeed,
             &(this->super_RTFusion).m_fusionPose);
  RTQuaternion::operator=
            ((RTQuaternion *)&(settings_local->super_RTIMUHal).field_0x1c,
             &(this->super_RTFusion).m_fusionQPose);
  return;
}

Assistant:

void RTFusionKalman4::newIMUData(RTIMU_DATA& data, const RTIMUSettings *settings)
{
    if (m_enableGyro)
        m_gyro = data.gyro;
    else
        m_gyro = RTVector3();
    m_accel = data.accel;
    m_compass = data.compass;
    m_compassValid = data.compassValid;

    if (m_firstTime) {
        m_lastFusionTime = data.timestamp;
        calculatePose(m_accel, m_compass, settings->m_compassAdjDeclination);
        m_Fk.fill(0);

        //  init covariance matrix to something

        m_Pkk.fill(0);
        for (int i = 0; i < 4; i++)
            for (int j = 0; j < 4; j++)
                m_Pkk.setVal(i,j, 0.5);

        // initialize the observation model Hk
        // Note: since the model is the state vector, this is an identity matrix so it won't be used

        //  initialize the poses

        m_stateQ.fromEuler(m_measuredPose);
        m_fusionQPose = m_stateQ;
        m_fusionPose = m_measuredPose;
        m_firstTime = false;
    } else {
        m_timeDelta = (RTFLOAT)(data.timestamp - m_lastFusionTime) / (RTFLOAT)1000000;
        m_lastFusionTime = data.timestamp;
        if (m_timeDelta <= 0)
            return;

        if (m_debug) {
            HAL_INFO("\n------\n");
            HAL_INFO1("IMU update delta time: %f\n", m_timeDelta);
        }

        calculatePose(data.accel, data.compass, settings->m_compassAdjDeclination);

        predict();
        update();
        m_stateQ.toEuler(m_fusionPose);
        m_fusionQPose = m_stateQ;

        if (m_debug) {
            HAL_INFO(RTMath::displayRadians("Measured pose", m_measuredPose));
            HAL_INFO(RTMath::displayRadians("Kalman pose", m_fusionPose));
            HAL_INFO(RTMath::displayRadians("Measured quat", m_measuredPose));
            HAL_INFO(RTMath::display("Kalman quat", m_stateQ));
            HAL_INFO(RTMath::display("Error quat", m_stateQError));
         }
    }
    data.fusionPoseValid = true;
    data.fusionQPoseValid = true;
    data.fusionPose = m_fusionPose;
    data.fusionQPose = m_fusionQPose;
}